

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * url_encode(char *in)

{
  char *out;
  size_t out_len;
  char *d;
  char *s;
  char *in_local;
  
  out = (char *)0x0;
  d = in;
  do {
    if (*d == '\0') {
      in_local = (char *)malloc((size_t)(out + 1));
      out_len = (size_t)in_local;
      d = in;
      if (in_local == (char *)0x0) {
        in_local = (char *)0x0;
      }
      else {
        for (; *d != '\0'; d = d + 1) {
          if ((((*d < '!') || ('~' < *d)) || (*d == '%')) || (*d == '=')) {
            *(undefined1 *)out_len = 0x25;
            *(char *)(out_len + 1) = "0123456789ABCDEF"[(int)((int)*d >> 4 & 0xf)];
            *(char *)(out_len + 2) = "0123456789ABCDEF"[(int)((int)*d & 0xf)];
            out_len = out_len + 3;
          }
          else {
            *(char *)out_len = *d;
            out_len = out_len + 1;
          }
        }
        *(undefined1 *)out_len = 0;
      }
      return in_local;
    }
    if (((*d < '!') || ('~' < *d)) || ((*d == '%' || (*d == '=')))) {
      if (-(long)out - 1U < 4) {
        return (char *)0x0;
      }
      out = out + 3;
    }
    else {
      if (-(long)out - 1U < 2) {
        return (char *)0x0;
      }
      out = out + 1;
    }
    d = d + 1;
  } while( true );
}

Assistant:

static char *
url_encode(const char *in)
{
	const char *s;
	char *d;
	size_t out_len = 0;
	char *out;

	for (s = in; *s != '\0'; s++) {
		if (*s < 33 || *s > 126 || *s == '%' || *s == '=') {
			if (SIZE_MAX - out_len < 4)
				return (NULL);
			out_len += 3;
		} else {
			if (SIZE_MAX - out_len < 2)
				return (NULL);
			out_len++;
		}
	}

	out = malloc(out_len + 1);
	if (out == NULL)
		return (NULL);

	for (s = in, d = out; *s != '\0'; s++) {
		/* encode any non-printable ASCII character or '%' or '=' */
		if (*s < 33 || *s > 126 || *s == '%' || *s == '=') {
			/* URL encoding is '%' followed by two hex digits */
			*d++ = '%';
			*d++ = "0123456789ABCDEF"[0x0f & (*s >> 4)];
			*d++ = "0123456789ABCDEF"[0x0f & *s];
		} else {
			*d++ = *s;
		}
	}
	*d = '\0';
	return (out);
}